

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::RadioButtonStyle> __thiscall
gui::DefaultTheme::makeRadioButtonStyle(DefaultTheme *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Gui *in_RDI;
  shared_ptr<gui::RadioButtonStyle> sVar1;
  shared_ptr<gui::RadioButtonStyle> *style;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined1 diamond;
  CheckBoxStyle *in_stack_ffffffffffffffa0;
  Vector3<float> local_30 [2];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<gui::RadioButtonStyle,gui::Gui_const&>(in_RDI);
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a93d);
  CheckBoxStyle::setFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a958);
  CheckBoxStyle::setOutlineColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a973);
  CheckBoxStyle::setOutlineThickness(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a98f);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffffa0);
  CheckBoxStyle::setFont
            (in_stack_ffffffffffffffa0,
             (Font *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a9c4);
  CheckBoxStyle::setCharacterSize(in_stack_ffffffffffffffa0,(uint)in_stack_ffffffffffffff9c);
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a9dd);
  CheckBoxStyle::setTextFillColor
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16a9f8);
  CheckBoxStyle::setFillColorHover
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16aa13);
  CheckBoxStyle::setFillColorChecked
            (in_stack_ffffffffffffffa0,
             (Color *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = std::
            __shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16aa2e);
  sf::Vector3<float>::Vector3(local_30,8.0,1.0,*(float *)(in_RSI + 0x50));
  CheckBoxStyle::setTextPadding
            (&this_00->super_CheckBoxStyle,
             (Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  diamond = (undefined1)((uint)in_stack_ffffffffffffff9c >> 0x18);
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x16aa77);
  RadioButtonStyle::setDiamond(this_00,(bool)diamond);
  sVar1.super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<gui::RadioButtonStyle>)
         sVar1.super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<RadioButtonStyle> DefaultTheme::makeRadioButtonStyle() const {
    auto style = std::make_shared<RadioButtonStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(sf::Color::Black);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setFillColorHover(colorLightBlueTransparent);
    style->setFillColorChecked(colorDarkBlue);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    style->setDiamond(true);

    return style;
}